

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O1

void __thiscall iu_Optional_x_iutest_x_Compare_Test::Body(iu_Optional_x_iutest_x_Compare_Test *this)

{
  char *pcVar1;
  TestPartResultReporterInterface *pTVar2;
  TestFlag *pTVar3;
  Variable *pVVar4;
  optional<int> *in_R9;
  ScopedSPITestFlag guard;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  optional<int> opt_1;
  allocator<char> local_2ad;
  TestFlag local_2ac;
  undefined1 local_2a8 [32];
  char *local_288;
  undefined8 local_280;
  SPIFailureChecker local_278;
  AssertionResult local_240;
  AssertionResult local_218;
  undefined1 local_1f0 [128];
  ios_base local_170 [344];
  
  local_218.m_message._M_dataplus._M_p._0_4_ = 0;
  local_218.m_message._M_dataplus._M_p._4_4_ =
       CONCAT31(local_218.m_message._M_dataplus._M_p._5_3_,1);
  local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffff00000000;
  iutest::internal::CmpHelperEQ<int,std::optional<int>>
            ((AssertionResult *)local_2a8,(internal *)0x13f30d,"opt",local_1f0,(int *)&local_218,
             in_R9);
  if (local_288._0_1_ == false) {
    memset((iu_global_format_stringstream *)local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,(char *)local_2a8._0_8_,(allocator<char> *)&local_240);
    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x13f13e;
    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x100000053;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_278,(Fixed *)local_1f0,false);
    if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_278.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1f0);
    std::ios_base::~ios_base(local_170);
  }
  pcVar1 = local_2a8 + 0x10;
  if ((char *)local_2a8._0_8_ != pcVar1) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
  }
  local_218.m_message._M_dataplus._M_p._4_4_ =
       local_218.m_message._M_dataplus._M_p._4_4_ & 0xffffff00;
  iutest::internal::CmpHelperEQ<std::nullopt_t,std::optional<int>>
            ((AssertionResult *)local_2a8,(internal *)"::std::nullopt","opt","",
             (nullopt_t *)&local_218,in_R9);
  if (local_288._0_1_ == false) {
    memset((iu_global_format_stringstream *)local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,(char *)local_2a8._0_8_,(allocator<char> *)&local_240);
    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x13f13e;
    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x100000057;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_278,(Fixed *)local_1f0,false);
    if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_278.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1f0);
    std::ios_base::~ios_base(local_170);
  }
  if ((char *)local_2a8._0_8_ != pcVar1) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0014f180;
  local_278.m_Type = kNonFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2ac);
  local_1f0._0_4_ = 0x4d2;
  iutest::internal::CmpHelperEQ<int,std::optional<int>>
            (&local_218,(internal *)"1234","opt",local_1f0,(int *)&Body::opt,in_R9);
  if (local_218.m_result == false) {
    memset((iu_global_format_stringstream *)local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2a8,
               (char *)CONCAT44(local_218.m_message._M_dataplus._M_p._4_4_,
                                local_218.m_message._M_dataplus._M_p._0_4_),&local_2ad);
    local_288 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
    ;
    local_280._0_4_ = 0x5c;
    local_280._4_4_ = 1;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_2a8,(Fixed *)local_1f0,false);
    if ((char *)local_2a8._0_8_ != pcVar1) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1f0);
    std::ios_base::~ios_base(local_170);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_218.m_message._M_dataplus._M_p._4_4_,
                  local_218.m_message._M_dataplus._M_p._0_4_) != &local_218.m_message.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_218.m_message._M_dataplus._M_p._4_4_,
                             local_218.m_message._M_dataplus._M_p._0_4_),
                    local_218.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = local_2ac.m_test_flags;
  local_1f0._16_4_ = 0x34333231;
  local_1f0._8_8_ = 4;
  local_1f0._20_4_ = local_1f0._20_4_ & 0xffffff00;
  local_1f0._0_8_ = local_1f0 + 0x10;
  iutest::detail::SPIFailureChecker::GetResult(&local_240,&local_278,(string *)local_1f0);
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,CONCAT44(local_1f0._20_4_,local_1f0._16_4_) + 1);
  }
  local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0014f200;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar2 = local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0014f228;
  pVVar4 = iutest::TestEnv::get_vars();
  pVVar4->m_testpartresult_reporter = pTVar2;
  if (local_240.m_result == false) {
    memset((iu_global_format_stringstream *)local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,local_240.m_message._M_dataplus._M_p,
               (allocator<char> *)local_2a8);
    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x13f13e;
    local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x10000005c;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_278,(Fixed *)local_1f0,false);
    if (local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_278.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_278.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1f0);
    std::ios_base::~ios_base(local_170);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_message._M_dataplus._M_p != &local_240.m_message.field_2) {
    operator_delete(local_240.m_message._M_dataplus._M_p,
                    local_240.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(Optional, Compare)
{
    {
        ::std::optional<int> opt = 0;
        IUTEST_EXPECT_TRUE(opt);
        IUTEST_EXPECT_EQ(0, opt);
    }
    {
        ::std::optional<int> opt = ::std::nullopt;
        IUTEST_EXPECT_EQ(::std::nullopt, opt);
    }
    {
        static const ::std::optional<int> opt = ::std::nullopt;
        IUTEST_EXPECT_FALSE(opt);
        IUTEST_EXPECT_NONFATAL_FAILURE(IUTEST_EXPECT_EQ(1234, opt), "1234");
    }
}